

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

string * __thiscall
cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *pcVar1;
  ostream *poVar2;
  string pid;
  ostringstream e;
  string local_1b0 [32];
  ostream local_190;
  
  pcVar1 = idToString((PolicyID)this);
  std::__cxx11::string::string(local_1b0,pcVar1,(allocator *)&local_190);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar2 = std::operator<<(&local_190,"Policy ");
  poVar2 = std::operator<<(poVar2,local_1b0);
  poVar2 = std::operator<<(poVar2," may not be set to OLD behavior because this ");
  poVar2 = std::operator<<(poVar2,"version of CMake no longer supports it.  ");
  poVar2 = std::operator<<(poVar2,"The policy was introduced in ");
  poVar2 = std::operator<<(poVar2,"CMake version ");
  pcVar1 = idToVersion((PolicyID)this);
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,", and use of NEW behavior is now required.");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Please either update your CMakeLists.txt files to conform to ");
  poVar2 = std::operator<<(poVar2,"the new behavior or use an older version of CMake that still ");
  poVar2 = std::operator<<(poVar2,"supports the old behavior.  ");
  poVar2 = std::operator<<(poVar2,"Run cmake --help-policy ");
  poVar2 = std::operator<<(poVar2,local_1b0);
  std::operator<<(poVar2," for more information.");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::__cxx11::string::~string(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string
cmPolicies::GetRequiredAlwaysPolicyError(cmPolicies::PolicyID id)
{
  std::string pid = idToString(id);
  std::ostringstream e;
  e << "Policy " << pid << " may not be set to OLD behavior because this "
    << "version of CMake no longer supports it.  "
    << "The policy was introduced in "
    << "CMake version " << idToVersion(id)
    << ", and use of NEW behavior is now required."
    << "\n"
    << "Please either update your CMakeLists.txt files to conform to "
    << "the new behavior or use an older version of CMake that still "
    << "supports the old behavior.  "
    << "Run cmake --help-policy " << pid << " for more information.";
  return e.str();
}